

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmSourceFile * __thiscall
cmMakefile::AddCustomCommandToOutput
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *byproducts,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,string *main_dependency,cmCustomCommandLines *commandLines,char *comment,
          char *workingDir,bool replace,bool escapeOldStyle,bool uses_terminal,
          bool command_expand_lists,string *depfile)

{
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  cmCustomCommand *pcVar5;
  ostream *poVar6;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *pvVar7;
  cmSourceFile *pcVar8;
  pointer pcVar9;
  pointer pbVar10;
  cmSourceFile *local_200;
  allocator local_1f1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1e8;
  string local_1e0;
  cmCustomCommandLines *local_1c0;
  string *local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b0;
  ostringstream e;
  
  local_1f0 = outputs;
  local_1e8 = byproducts;
  if ((outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    cmSystemTools::Error
              ("Attempt to add a custom rule with no output!",(char *)0x0,(char *)0x0,(char *)0x0);
    return (cmSourceFile *)0x0;
  }
  pcVar2 = (commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar1 = (commandLines->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pcVar9 = pcVar1; pcVar9 != pcVar2; pcVar9 = pcVar9 + 1) {
    pbVar10 = (pcVar9->
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (((pbVar10 !=
          (pcVar9->
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) && (pbVar10->_M_string_length != 0)) &&
       (*(pbVar10->_M_dataplus)._M_p == '\"')) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar6 = std::operator<<((ostream *)&e,"COMMAND may not contain literal quotes:\n  ");
      poVar6 = std::operator<<(poVar6,(string *)
                                      (pcVar9->
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      std::operator<<(poVar6,"\n");
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      goto LAB_002bda18;
    }
  }
  local_1b0 = depends;
  if ((pcVar1 != pcVar2) && (main_dependency->_M_string_length != 0)) {
    local_200 = GetSource(this,main_dependency);
    if (local_200 == (cmSourceFile *)0x0) {
      local_200 = CreateSource(this,main_dependency,false);
      if (local_200 != (cmSourceFile *)0x0) goto LAB_002bd848;
    }
    else {
      pcVar5 = cmSourceFile::GetCustomCommand(local_200);
      if (pcVar5 == (cmCustomCommand *)0x0 || replace) goto LAB_002bd848;
      pcVar5 = cmSourceFile::GetCustomCommand(local_200);
      pvVar7 = &cmCustomCommand::GetCommandLines(pcVar5)->
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
      bVar3 = std::operator==(&commandLines->
                               super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                              ,pvVar7);
      if (bVar3) {
        return local_200;
      }
    }
  }
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x25])
            ((string *)&e,this->GlobalGenerator,
             (local_1f0->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  pcVar8 = GetSource(this,(string *)&e);
  if (pcVar8 == (cmSourceFile *)0x0) {
    local_200 = CreateSource(this,(string *)&e,true);
LAB_002bd7f8:
    std::__cxx11::string::string((string *)&local_1e0,"__CMAKE_RULE",&local_1f1);
    cmSourceFile::SetProperty(local_200,&local_1e0,"1");
    std::__cxx11::string::~string((string *)&local_1e0);
    bVar3 = true;
    pcVar8 = (cmSourceFile *)0x0;
  }
  else {
    pcVar5 = cmSourceFile::GetCustomCommand(pcVar8);
    local_200 = pcVar8;
    if (pcVar5 == (cmCustomCommand *)0x0 || replace) goto LAB_002bd7f8;
    pcVar5 = cmSourceFile::GetCustomCommand(pcVar8);
    pvVar7 = &cmCustomCommand::GetCommandLines(pcVar5)->
              super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
    bVar4 = std::operator!=(&commandLines->
                             super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                            ,pvVar7);
    bVar3 = false;
    if (bVar4) {
      cmSystemTools::Error
                ("Attempt to add a custom rule to output \"",_e,
                 "\" which already has a custom rule.",(char *)0x0);
      bVar3 = false;
    }
  }
  std::__cxx11::string::~string((string *)&e);
  if (!bVar3) {
    return pcVar8;
  }
LAB_002bd848:
  local_1c0 = commandLines;
  local_1b8 = main_dependency;
  for (pbVar10 = (local_1f0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pbVar10 !=
      (local_1f0->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
    pcVar8 = GetOrCreateSource(this,pbVar10,true);
    if (pcVar8 != (cmSourceFile *)0x0) {
      std::__cxx11::string::string((string *)&e,"GENERATED",(allocator *)&local_1e0);
      cmSourceFile::SetProperty(pcVar8,(string *)&e,"1");
      std::__cxx11::string::~string((string *)&e);
    }
  }
  for (pbVar10 = (local_1e8->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      pbVar10 !=
      (local_1e8->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
    pcVar8 = GetOrCreateSource(this,pbVar10,true);
    if (pcVar8 != (cmSourceFile *)0x0) {
      std::__cxx11::string::string((string *)&e,"GENERATED",(allocator *)&local_1e0);
      cmSourceFile::SetProperty(pcVar8,(string *)&e,"1");
      std::__cxx11::string::~string((string *)&e);
    }
  }
  if (local_200 == (cmSourceFile *)0x0) {
LAB_002bda18:
    local_200 = (cmSourceFile *)0x0;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&e,local_1b0);
    if (local_1b8->_M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&e,local_1b8);
    }
    pcVar5 = (cmCustomCommand *)operator_new(0x100);
    cmCustomCommand::cmCustomCommand
              (pcVar5,this,local_1f0,local_1e8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&e,local_1c0,comment,workingDir);
    cmCustomCommand::SetEscapeOldStyle(pcVar5,escapeOldStyle);
    cmCustomCommand::SetEscapeAllowMakeVars(pcVar5,true);
    cmCustomCommand::SetUsesTerminal(pcVar5,uses_terminal);
    cmCustomCommand::SetCommandExpandLists(pcVar5,command_expand_lists);
    cmCustomCommand::SetDepfile(pcVar5,depfile);
    cmSourceFile::SetCustomCommand(local_200,pcVar5);
    UpdateOutputToSourceMap(this,local_1f0,local_200);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&e);
  }
  return local_200;
}

Assistant:

cmSourceFile* cmMakefile::AddCustomCommandToOutput(
  const std::vector<std::string>& outputs,
  const std::vector<std::string>& byproducts,
  const std::vector<std::string>& depends, const std::string& main_dependency,
  const cmCustomCommandLines& commandLines, const char* comment,
  const char* workingDir, bool replace, bool escapeOldStyle,
  bool uses_terminal, bool command_expand_lists, const std::string& depfile)
{
  // Make sure there is at least one output.
  if (outputs.empty()) {
    cmSystemTools::Error("Attempt to add a custom rule with no output!");
    return CM_NULLPTR;
  }

  // Validate custom commands.  TODO: More strict?
  for (cmCustomCommandLines::const_iterator i = commandLines.begin();
       i != commandLines.end(); ++i) {
    cmCustomCommandLine const& cl = *i;
    if (!cl.empty() && !cl[0].empty() && cl[0][0] == '"') {
      std::ostringstream e;
      e << "COMMAND may not contain literal quotes:\n  " << cl[0] << "\n";
      this->IssueMessage(cmake::FATAL_ERROR, e.str());
      return CM_NULLPTR;
    }
  }

  // Choose a source file on which to store the custom command.
  cmSourceFile* file = CM_NULLPTR;
  if (!commandLines.empty() && !main_dependency.empty()) {
    // The main dependency was specified.  Use it unless a different
    // custom command already used it.
    file = this->GetSource(main_dependency);
    if (file && file->GetCustomCommand() && !replace) {
      // The main dependency already has a custom command.
      if (commandLines == file->GetCustomCommand()->GetCommandLines()) {
        // The existing custom command is identical.  Silently ignore
        // the duplicate.
        return file;
      }
      // The existing custom command is different.  We need to
      // generate a rule file for this new command.
      file = CM_NULLPTR;
    } else if (!file) {
      file = this->CreateSource(main_dependency);
    }
  }

  // Generate a rule file if the main dependency is not available.
  if (!file) {
    cmGlobalGenerator* gg = this->GetGlobalGenerator();

    // Construct a rule file associated with the first output produced.
    std::string outName = gg->GenerateRuleFile(outputs[0]);

    // Check if the rule file already exists.
    file = this->GetSource(outName);
    if (file && file->GetCustomCommand() && !replace) {
      // The rule file already exists.
      if (commandLines != file->GetCustomCommand()->GetCommandLines()) {
        cmSystemTools::Error("Attempt to add a custom rule to output \"",
                             outName.c_str(),
                             "\" which already has a custom rule.");
      }
      return file;
    }

    // Create a cmSourceFile for the rule file.
    if (!file) {
      file = this->CreateSource(outName, true);
    }
    file->SetProperty("__CMAKE_RULE", "1");
  }

  // Always create the output sources and mark them generated.
  for (std::vector<std::string>::const_iterator o = outputs.begin();
       o != outputs.end(); ++o) {
    if (cmSourceFile* out = this->GetOrCreateSource(*o, true)) {
      out->SetProperty("GENERATED", "1");
    }
  }
  for (std::vector<std::string>::const_iterator o = byproducts.begin();
       o != byproducts.end(); ++o) {
    if (cmSourceFile* out = this->GetOrCreateSource(*o, true)) {
      out->SetProperty("GENERATED", "1");
    }
  }

  // Attach the custom command to the file.
  if (file) {
    // Construct a complete list of dependencies.
    std::vector<std::string> depends2(depends);
    if (!main_dependency.empty()) {
      depends2.push_back(main_dependency);
    }

    cmCustomCommand* cc = new cmCustomCommand(
      this, outputs, byproducts, depends2, commandLines, comment, workingDir);
    cc->SetEscapeOldStyle(escapeOldStyle);
    cc->SetEscapeAllowMakeVars(true);
    cc->SetUsesTerminal(uses_terminal);
    cc->SetCommandExpandLists(command_expand_lists);
    cc->SetDepfile(depfile);
    file->SetCustomCommand(cc);
    this->UpdateOutputToSourceMap(outputs, file);
  }
  return file;
}